

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
SectionHdrWrapper::splitCharacteristics
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,DWORD charact
          )

{
  _Base_ptr p_Var1;
  
  if (s_secHdrCharact._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    initSecCharacter(&s_secHdrCharact);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = s_secHdrCharact._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &s_secHdrCharact._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if ((p_Var1[1]._M_color & charact) != _S_red) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&p_Var1[1]._M_color);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DWORD> SectionHdrWrapper::splitCharacteristics(DWORD charact)
{
    if (s_secHdrCharact.size() == 0) {
        initSecCharacter(s_secHdrCharact);
    }
    std::vector<DWORD> chSet;
    std::map<DWORD, QString>::iterator iter;
    for (iter = s_secHdrCharact.begin(); iter != s_secHdrCharact.end(); ++iter) {
        if (charact & iter->first) {
            chSet.push_back(iter->first);
        }
    }
    return chSet;
}